

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_verify(secp256k1_fe *a)

{
  uint uVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  undefined4 extraout_EAX;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  int iStack_44;
  uchar auStack_40 [32];
  
  uVar1 = a->magnitude;
  if (uVar1 < 0x21) {
    uVar2 = a->normalized;
    if (1 < uVar2) goto LAB_00128ee4;
    if ((int)uVar1 < 2 || uVar2 == 0) {
      uVar9 = 1;
      if (uVar2 == 0) {
        uVar9 = (ulong)(uVar1 * 2);
      }
      puVar3 = a->n;
      uVar10 = (uVar9 << 0x34) - uVar9;
      if (uVar10 < *puVar3) goto LAB_00128ee9;
      puVar4 = a->n;
      if (uVar10 < puVar4[1]) goto LAB_00128eee;
      puVar5 = a->n;
      if (uVar10 < puVar5[2]) goto LAB_00128ef3;
      puVar6 = a->n;
      if (uVar10 < puVar6[3]) goto LAB_00128ef8;
      a = (secp256k1_fe *)a->n[4];
      if (a <= (secp256k1_fe *)((uVar9 << 0x30) - uVar9)) {
        bVar8 = a != (secp256k1_fe *)0xffffffffffff || uVar2 == 0;
        a = (secp256k1_fe *)CONCAT71((int7)((ulong)a >> 8),bVar8);
        if (((bVar8) || (*puVar3 < 0xffffefffffc2f)) ||
           ((puVar5[2] & puVar4[1] & puVar6[3]) != 0xfffffffffffff)) {
          return;
        }
        goto LAB_00128f07;
      }
      goto LAB_00128efd;
    }
  }
  else {
    secp256k1_fe_verify_cold_9();
LAB_00128ee4:
    secp256k1_fe_verify_cold_8();
LAB_00128ee9:
    secp256k1_fe_verify_cold_6();
LAB_00128eee:
    secp256k1_fe_verify_cold_5();
LAB_00128ef3:
    secp256k1_fe_verify_cold_4();
LAB_00128ef8:
    secp256k1_fe_verify_cold_3();
LAB_00128efd:
    secp256k1_fe_verify_cold_2();
  }
  secp256k1_fe_verify_cold_7();
LAB_00128f07:
  secp256k1_fe_verify_cold_1();
  do {
    do {
      iStack_44 = 0;
      secp256k1_testrand256(auStack_40);
      secp256k1_scalar_set_b32((secp256k1_scalar *)a,auStack_40,&iStack_44);
    } while (iStack_44 != 0);
    auVar11._0_4_ = -(uint)((int)a->n[2] == 0 && (int)a->n[0] == 0);
    auVar11._4_4_ = -(uint)(*(int *)((long)a->n + 0x14) == 0 && *(int *)((long)a->n + 4) == 0);
    auVar11._8_4_ = -(uint)((int)a->n[3] == 0 && (int)a->n[1] == 0);
    auVar11._12_4_ = -(uint)(*(int *)((long)a->n + 0x1c) == 0 && *(int *)((long)a->n + 0xc) == 0);
    iVar7 = movmskps(extraout_EAX,auVar11);
  } while (iVar7 == 0xf);
  return;
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    VERIFY_CHECK((a->magnitude >= 0) && (a->magnitude <= 32));
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) VERIFY_CHECK(a->magnitude <= 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}